

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegionChecker.cpp
# Opt level: O0

void __thiscall RegionChecker::printRegions(RegionChecker *this)

{
  const_reference cVar1;
  ulong uVar2;
  size_type sVar3;
  RegionChecker *in_RDI;
  vector<bool,_std::allocator<bool>_> *in_stack_00000010;
  int i;
  int startMarker;
  bool inUnusedRegion;
  undefined4 in_stack_ffffffffffffffe8;
  int iVar4;
  int iVar5;
  uint3 in_stack_fffffffffffffff4;
  uint uVar6;
  
  uVar6 = (uint)in_stack_fffffffffffffff4;
  iVar5 = 0;
  iVar4 = 0;
  while( true ) {
    uVar2 = (ulong)iVar4;
    sVar3 = std::vector<bool,_std::allocator<bool>_>::size(in_stack_00000010);
    if (sVar3 <= uVar2) break;
    if (((uVar6 & 0x1000000) != 0) ||
       (cVar1 = std::vector<bool,_std::allocator<bool>_>::operator[]
                          ((vector<bool,_std::allocator<bool>_> *)CONCAT44(uVar6,iVar5),
                           CONCAT44(iVar4,in_stack_ffffffffffffffe8)), cVar1)) {
      if (((uVar6 & 0x1000000) != 0) &&
         (cVar1 = std::vector<bool,_std::allocator<bool>_>::operator[]
                            ((vector<bool,_std::allocator<bool>_> *)CONCAT44(uVar6,iVar5),
                             CONCAT44(iVar4,in_stack_ffffffffffffffe8)), cVar1)) {
        uVar6 = uVar6 & 0xffffff;
        printRange(in_RDI,(int)(uVar2 >> 0x20),(int)uVar2);
      }
    }
    else {
      uVar6 = CONCAT13(1,(int3)uVar6);
      iVar5 = iVar4;
    }
    iVar4 = iVar4 + 1;
  }
  if ((uVar6 & 0x1000000) != 0) {
    std::vector<bool,_std::allocator<bool>_>::size(in_stack_00000010);
    printRange(in_RDI,(int)(uVar2 >> 0x20),(int)uVar2);
  }
  return;
}

Assistant:

void RegionChecker::printRegions() const {
	bool inUnusedRegion = false;
	int startMarker = 0;
	for (int i = 0; i < usedBits.size(); i++) {
		if (!inUnusedRegion && usedBits[i] == false) {
			inUnusedRegion = true;
			startMarker = i;
		}
		else if (inUnusedRegion && usedBits[i] == true) {
			inUnusedRegion = false;
			printRange(startMarker, i);
		}
	}
	if (inUnusedRegion) {
		printRange(startMarker, usedBits.size());
	}
}